

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

Value * __thiscall GlobOpt::NewGenericValue(GlobOpt *this,ValueType valueType,Sym *sym)

{
  ValueInfo *valueInfo_00;
  Value *value;
  GlobOptBlockData *this_00;
  Value *val;
  ValueInfo *valueInfo;
  Sym *sym_local;
  GlobOpt *this_local;
  ValueType valueType_local;
  
  valueInfo_00 = ValueInfo::New(this->alloc,valueType);
  value = NewValue(this,valueInfo_00);
  TrackNewValueForKills(this,value);
  this_00 = CurrentBlockData(this);
  GlobOptBlockData::SetValue(this_00,value,sym);
  return value;
}

Assistant:

Value *
GlobOpt::NewGenericValue(const ValueType valueType, Sym *const sym)
{
    ValueInfo *valueInfo = ValueInfo::New(this->alloc, valueType);
    Value *val = NewValue(valueInfo);
    TrackNewValueForKills(val);

    CurrentBlockData()->SetValue(val, sym);
    return val;
}